

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void update_firstpass_stats
               (AV1_COMP *cpi,FRAME_STATS *stats,double raw_err_stdev,int frame_number,
               int64_t ts_duration,BLOCK_SIZE fp_block_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int num_mbs_16X16;
  AV1_PRIMARY *pAVar5;
  FIRSTPASS_STATS *pFVar6;
  STATS_BUFFER_CTX *pSVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int *piVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double local_158;
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  double local_e8;
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  double local_38;
  
  pAVar5 = cpi->ppi;
  pFVar6 = ((pAVar5->twopass).stats_buf_ctx)->stats_in_end;
  piVar12 = &cpi->initial_mbs;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
    piVar12 = &(cpi->common).mi_params.MBs;
  }
  num_mbs_16X16 = *piVar12;
  iVar11 = get_num_mbs(fp_block_size,num_mbs_16X16);
  dVar21 = (double)iVar11;
  if (dVar21 < 0.0) {
    dVar15 = sqrt(dVar21);
  }
  else {
    dVar15 = SQRT(dVar21);
  }
  local_80 = 0.0;
  dVar15 = dVar15 * 200.0;
  local_118._8_8_ = stats->intra_factor * stats->brightness_factor;
  local_118._0_8_ = (undefined8)frame_number;
  uVar3 = stats->coded_error;
  uVar4 = stats->sr_coded_error;
  local_68 = 1.0;
  local_e8 = (double)stats->inter_count / dVar21;
  auVar19._0_8_ = (double)stats->second_ref_count;
  auVar19._8_8_ = stats->neutral_count;
  auVar24._8_4_ = SUB84(dVar21,0);
  auVar24._0_8_ = dVar21;
  auVar24._12_4_ = (int)((ulong)dVar21 >> 0x20);
  local_d8 = divpd(auVar19,auVar24);
  local_c8 = (double)stats->intra_skip_count / dVar21;
  local_c0 = (double)stats->image_data_start_row;
  local_b8 = 0.0;
  auVar23._0_8_ = dVar15 + (double)CONCAT44((int)((long)uVar3 >> 0x28),(int)((ulong)uVar3 >> 8));
  auVar23._8_8_ = dVar15 + (double)CONCAT44((int)((long)uVar4 >> 0x28),(int)((ulong)uVar4 >> 8));
  auVar22._0_8_ = (double)(stats->intra_error >> 8) + dVar15;
  local_58 = ZEXT816(0);
  local_48 = 1.0;
  iVar11 = stats->mv_count;
  dVar15 = 0.0;
  local_e0 = 0.0;
  auVar27 = ZEXT816(0);
  auVar19 = ZEXT816(0);
  auVar24 = local_58;
  if (0 < iVar11) {
    local_e0 = (double)iVar11;
    dVar15 = (double)stats->sum_mvr;
    auVar20._8_8_ = local_e0;
    auVar20._0_8_ = local_e0;
    auVar27._8_8_ = (double)stats->sum_mvr_abs;
    auVar27._0_8_ = dVar15;
    auVar24 = divpd(auVar27,auVar20);
    auVar26._0_8_ = (double)stats->sum_mvc;
    auVar26._8_8_ = (double)stats->sum_mvc_abs;
    auVar27 = divpd(auVar26,auVar20);
    auVar18._0_8_ = dVar15 * dVar15;
    auVar18._8_8_ = auVar26._0_8_ * auVar26._0_8_;
    auVar19 = divpd(auVar18,auVar20);
    auVar25._0_8_ = (double)stats->sum_mvrs - auVar19._0_8_;
    auVar25._8_8_ = (double)stats->sum_mvcs - auVar19._8_8_;
    auVar19 = divpd(auVar25,auVar20);
    local_80 = (double)stats->sum_in_vectors / (double)(iVar11 * 2);
    dVar15 = (double)stats->new_mv_count;
    local_e0 = local_e0 / dVar21;
  }
  local_70 = (double)ts_duration;
  dVar21 = (double)num_mbs_16X16;
  auVar8._8_8_ = dVar21;
  auVar8._0_8_ = dVar21;
  local_f8 = divpd(auVar23,auVar8);
  auVar22._8_8_ = (double)stats->frame_avg_wavelet_energy;
  auVar9._8_8_ = dVar21;
  auVar9._0_8_ = dVar21;
  auVar23 = divpd(auVar22,auVar9);
  uVar1 = (cpi->common).width;
  uVar2 = (cpi->common).height;
  dVar16 = (double)(int)uVar1;
  dVar17 = (double)(int)uVar2;
  local_118._16_16_ = auVar23;
  local_60 = raw_err_stdev;
  local_38 = log1p(local_f8._0_8_);
  local_158 = auVar23._0_8_;
  local_40 = log1p(local_158);
  auVar13._8_8_ = dVar17;
  auVar13._0_8_ = dVar17;
  local_b0 = divpd(auVar24,auVar13);
  auVar14._8_8_ = dVar16;
  auVar14._0_8_ = dVar16;
  local_a0 = divpd(auVar27,auVar14);
  auVar10._8_8_ = dVar16 * dVar16;
  auVar10._0_8_ = dVar17 * dVar17;
  local_90 = divpd(auVar19,auVar10);
  local_78 = dVar15 / dVar21;
  memcpy(pFVar6,local_118,0xe8);
  if (cpi->ppi->lap_enabled == 0) {
    output_stats(pFVar6,cpi->ppi->output_pkt_list);
  }
  else {
    av1_firstpass_info_push(&(pAVar5->twopass).firstpass_info,pFVar6);
  }
  pFVar6 = ((cpi->ppi->twopass).stats_buf_ctx)->total_stats;
  if (pFVar6 != (FIRSTPASS_STATS *)0x0) {
    av1_accumulate_stats(pFVar6,(FIRSTPASS_STATS *)local_118);
  }
  pSVar7 = (pAVar5->twopass).stats_buf_ctx;
  pFVar6 = pSVar7->stats_in_end;
  pSVar7->stats_in_end = pFVar6 + 1;
  if (((cpi->use_ducky_encode == 0) && ((cpi->oxcf).pass == AOM_RC_FIRST_PASS)) &&
     (pSVar7->stats_in_buf_end <= pFVar6 + 1)) {
    pSVar7->stats_in_end = pSVar7->stats_in_start;
  }
  return;
}

Assistant:

static void update_firstpass_stats(AV1_COMP *cpi,
                                   const FRAME_STATS *const stats,
                                   const double raw_err_stdev,
                                   const int frame_number,
                                   const int64_t ts_duration,
                                   const BLOCK_SIZE fp_block_size) {
  TWO_PASS *twopass = &cpi->ppi->twopass;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  FIRSTPASS_STATS fps;
  // The minimum error here insures some bit allocation to frames even
  // in static regions. The allocation per MB declines for larger formats
  // where the typical "real" energy per MB also falls.
  // Initial estimate here uses sqrt(mbs) to define the min_err, where the
  // number of mbs is proportional to the image area.
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  const double min_err = 200 * sqrt(num_mbs);

  fps.weight = stats->intra_factor * stats->brightness_factor;
  fps.frame = frame_number;
  fps.coded_error = (double)(stats->coded_error >> 8) + min_err;
  fps.sr_coded_error = (double)(stats->sr_coded_error >> 8) + min_err;
  fps.intra_error = (double)(stats->intra_error >> 8) + min_err;
  fps.frame_avg_wavelet_energy = (double)stats->frame_avg_wavelet_energy;
  fps.count = 1.0;
  fps.pcnt_inter = (double)stats->inter_count / num_mbs;
  fps.pcnt_second_ref = (double)stats->second_ref_count / num_mbs;
  fps.pcnt_neutral = (double)stats->neutral_count / num_mbs;
  fps.intra_skip_pct = (double)stats->intra_skip_count / num_mbs;
  fps.inactive_zone_rows = (double)stats->image_data_start_row;
  fps.inactive_zone_cols = 0.0;  // Placeholder: not currently supported.
  fps.raw_error_stdev = raw_err_stdev;
  fps.is_flash = 0;
  fps.noise_var = 0.0;
  fps.cor_coeff = 1.0;
  fps.log_coded_error = 0.0;
  fps.log_intra_error = 0.0;

  if (stats->mv_count > 0) {
    fps.MVr = (double)stats->sum_mvr / stats->mv_count;
    fps.mvr_abs = (double)stats->sum_mvr_abs / stats->mv_count;
    fps.MVc = (double)stats->sum_mvc / stats->mv_count;
    fps.mvc_abs = (double)stats->sum_mvc_abs / stats->mv_count;
    fps.MVrv = ((double)stats->sum_mvrs -
                ((double)stats->sum_mvr * stats->sum_mvr / stats->mv_count)) /
               stats->mv_count;
    fps.MVcv = ((double)stats->sum_mvcs -
                ((double)stats->sum_mvc * stats->sum_mvc / stats->mv_count)) /
               stats->mv_count;
    fps.mv_in_out_count = (double)stats->sum_in_vectors / (stats->mv_count * 2);
    fps.new_mv_count = stats->new_mv_count;
    fps.pcnt_motion = (double)stats->mv_count / num_mbs;
  } else {
    fps.MVr = 0.0;
    fps.mvr_abs = 0.0;
    fps.MVc = 0.0;
    fps.mvc_abs = 0.0;
    fps.MVrv = 0.0;
    fps.MVcv = 0.0;
    fps.mv_in_out_count = 0.0;
    fps.new_mv_count = 0.0;
    fps.pcnt_motion = 0.0;
  }

  // TODO(paulwilkins):  Handle the case when duration is set to 0, or
  // something less than the full time between subsequent values of
  // cpi->source_time_stamp.
  fps.duration = (double)ts_duration;

  normalize_firstpass_stats(&fps, num_mbs_16X16, cm->width, cm->height);

  // We will store the stats inside the persistent twopass struct (and NOT the
  // local variable 'fps'), and then cpi->output_pkt_list will point to it.
  *this_frame_stats = fps;
  if (!cpi->ppi->lap_enabled) {
    output_stats(this_frame_stats, cpi->ppi->output_pkt_list);
  } else {
    av1_firstpass_info_push(&twopass->firstpass_info, this_frame_stats);
  }
  if (cpi->ppi->twopass.stats_buf_ctx->total_stats != NULL) {
    av1_accumulate_stats(cpi->ppi->twopass.stats_buf_ctx->total_stats, &fps);
  }
  twopass->stats_buf_ctx->stats_in_end++;
  // When ducky encode is on, we always use linear buffer for stats_buf_ctx.
  if (cpi->use_ducky_encode == 0) {
    // TODO(angiebird): Figure out why first pass uses circular buffer.
    /* In the case of two pass, first pass uses it as a circular buffer,
     * when LAP is enabled it is used as a linear buffer*/
    if ((cpi->oxcf.pass == AOM_RC_FIRST_PASS) &&
        (twopass->stats_buf_ctx->stats_in_end >=
         twopass->stats_buf_ctx->stats_in_buf_end)) {
      twopass->stats_buf_ctx->stats_in_end =
          twopass->stats_buf_ctx->stats_in_start;
    }
  }
}